

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O0

void __thiscall
Fad<double>::Fad<FadBinaryMinus<Fad<double>,FadCst<double>>>
          (Fad<double> *this,FadExpr<FadBinaryMinus<Fad<double>,_FadCst<double>_>_> *fadexpr)

{
  int iVar1;
  double *pdVar2;
  FadSuper *in_RDI;
  value_type vVar3;
  int i;
  int sz;
  int in_stack_ffffffffffffff9c;
  FadExpr<FadBinaryMinus<Fad<double>,_FadCst<double>_>_> *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffdc;
  int i_00;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  FadSuper::FadSuper(in_RDI);
  vVar3 = FadExpr<FadBinaryMinus<Fad<double>,_FadCst<double>_>_>::val
                    ((FadExpr<FadBinaryMinus<Fad<double>,_FadCst<double>_>_> *)0x15211cf);
  *(value_type *)in_RDI = vVar3;
  FadExpr<FadBinaryMinus<Fad<double>,_FadCst<double>_>_>::size
            ((FadExpr<FadBinaryMinus<Fad<double>,_FadCst<double>_>_> *)0x15211fe);
  Vector<double>::Vector
            ((Vector<double> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffdc);
  *(undefined8 *)(in_RDI + 0x18) = 0;
  iVar1 = FadExpr<FadBinaryMinus<Fad<double>,_FadCst<double>_>_>::size
                    ((FadExpr<FadBinaryMinus<Fad<double>,_FadCst<double>_>_> *)0x152122b);
  if (iVar1 != 0) {
    for (i_00 = 0; i_00 < iVar1; i_00 = i_00 + 1) {
      in_stack_ffffffffffffffa0 =
           (FadExpr<FadBinaryMinus<Fad<double>,_FadCst<double>_>_> *)
           FadExpr<FadBinaryMinus<Fad<double>,_FadCst<double>_>_>::dx
                     (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      pdVar2 = Vector<double>::operator[]((Vector<double> *)(in_RDI + 8),i_00);
      *pdVar2 = (double)in_stack_ffffffffffffffa0;
    }
  }
  return;
}

Assistant:

inline Fad(const FadExpr<ExprT>& fadexpr) : 
    val_(fadexpr.val()), 
    dx_(fadexpr.size()), 
    defaultVal(T(0))
    {
      int sz = fadexpr.size();

      if ( sz ) {
        for(int i=0; i<sz; ++i) 
          dx_[i] = fadexpr.dx(i);
      }
    }